

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintVersion(cmDocumentation *this,ostream *os)

{
  char *pcVar1;
  ostream *poVar2;
  ostream *os_local;
  cmDocumentation *this_local;
  
  pcVar1 = GetNameString(this);
  poVar2 = std::operator<<(os,pcVar1);
  poVar2 = std::operator<<(poVar2," version ");
  pcVar1 = cmVersion::GetCMakeVersion();
  poVar2 = std::operator<<(poVar2,pcVar1);
  std::operator<<(poVar2,
                  "\n\nCMake suite maintained and supported by Kitware (kitware.com/cmake).\n");
  return true;
}

Assistant:

bool cmDocumentation::PrintVersion(std::ostream& os)
{
  /* clang-format off */
  os <<
    this->GetNameString() <<
    " version " << cmVersion::GetCMakeVersion() << "\n"
    "\n"
    "CMake suite maintained and supported by Kitware (kitware.com/cmake).\n"
    ;
  /* clang-format on */
  return true;
}